

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineSamplerTests.cpp
# Opt level: O0

string * __thiscall
vkt::pipeline::(anonymous_namespace)::getAddressModesCaseName_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,VkSamplerAddressMode u,
          VkSamplerAddressMode v,VkSamplerAddressMode w,BorderColor border)

{
  char *pcVar1;
  ostream *poVar2;
  VkSamplerAddressMode value;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  allocator<char> local_279;
  string local_278 [8];
  string fullNameW;
  string local_250 [8];
  string fullNameV;
  string local_228 [8];
  string fullNameU;
  string local_1e8;
  allocator<char> local_1c5 [13];
  string local_1b8 [8];
  string fullName;
  ostringstream caseName;
  BorderColor border_local;
  VkSamplerAddressMode w_local;
  VkSamplerAddressMode v_local;
  VkSamplerAddressMode u_local;
  
  value = (VkSamplerAddressMode)this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(fullName.field_2._M_local_buf + 8));
  if ((value == u) && (u == v)) {
    pcVar1 = ::vk::getSamplerAddressModeName(value);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1b8,pcVar1,local_1c5);
    std::allocator<char>::~allocator(local_1c5);
    std::operator<<((ostream *)(fullName.field_2._M_local_buf + 8),"all_");
    std::__cxx11::string::substr((ulong)((long)&fullNameU.field_2 + 8),(ulong)local_1b8);
    de::toLower(&local_1e8,(string *)((long)&fullNameU.field_2 + 8));
    std::operator<<((ostream *)(fullName.field_2._M_local_buf + 8),(string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)(fullNameU.field_2._M_local_buf + 8));
    if (value == VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_BORDER) {
      poVar2 = std::operator<<((ostream *)(fullName.field_2._M_local_buf + 8),"_");
      std::operator<<(poVar2,pipeline::anon_unknown_0::getAddressModesCaseName::borderColorNames[w])
      ;
    }
    std::__cxx11::string::~string(local_1b8);
  }
  else {
    pcVar1 = ::vk::getSamplerAddressModeName(value);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_228,pcVar1,(allocator<char> *)(fullNameV.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(fullNameV.field_2._M_local_buf + 0xf));
    pcVar1 = ::vk::getSamplerAddressModeName(u);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_250,pcVar1,(allocator<char> *)(fullNameW.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(fullNameW.field_2._M_local_buf + 0xf));
    pcVar1 = ::vk::getSamplerAddressModeName(v);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_278,pcVar1,&local_279);
    std::allocator<char>::~allocator(&local_279);
    poVar2 = std::operator<<((ostream *)(fullName.field_2._M_local_buf + 8),"uvw");
    poVar2 = std::operator<<(poVar2,"_");
    std::__cxx11::string::substr((ulong)&local_2c0,(ulong)local_228);
    de::toLower(&local_2a0,&local_2c0);
    poVar2 = std::operator<<(poVar2,(string *)&local_2a0);
    poVar2 = std::operator<<(poVar2,"_");
    std::__cxx11::string::substr((ulong)&local_300,(ulong)local_250);
    de::toLower(&local_2e0,&local_300);
    poVar2 = std::operator<<(poVar2,(string *)&local_2e0);
    poVar2 = std::operator<<(poVar2,"_");
    std::__cxx11::string::substr((ulong)&local_340,(ulong)local_278);
    de::toLower(&local_320,&local_340);
    std::operator<<(poVar2,(string *)&local_320);
    std::__cxx11::string::~string((string *)&local_320);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_2e0);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string(local_278);
    std::__cxx11::string::~string(local_250);
    std::__cxx11::string::~string(local_228);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(fullName.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string getAddressModesCaseName (VkSamplerAddressMode u, VkSamplerAddressMode v, VkSamplerAddressMode w, BorderColor border)
{
	static const char* borderColorNames[BORDER_COLOR_COUNT] =
	{
		"opaque_black",
		"opaque_white",
		"transparent_black",
	};

	std::ostringstream caseName;

	if (u == v && v == w)
	{
		const std::string fullName = getSamplerAddressModeName(u);
		DE_ASSERT(de::beginsWith(fullName, "VK_SAMPLER_ADDRESS_"));

		caseName << "all_";
		caseName << de::toLower(fullName.substr(19));

		if (u == VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_BORDER)
		{
			caseName << "_" << borderColorNames[border];
		}
	}
	else
	{
		const std::string fullNameU = getSamplerAddressModeName(u);
		const std::string fullNameV = getSamplerAddressModeName(v);
		const std::string fullNameW = getSamplerAddressModeName(w);

		DE_ASSERT(de::beginsWith(fullNameU, "VK_SAMPLER_ADDRESS_"));
		DE_ASSERT(de::beginsWith(fullNameV, "VK_SAMPLER_ADDRESS_"));
		DE_ASSERT(de::beginsWith(fullNameW, "VK_SAMPLER_ADDRESS_"));

		caseName << "uvw"
				 << "_" << de::toLower(fullNameU.substr(19))
				 << "_" << de::toLower(fullNameV.substr(19))
				 << "_" << de::toLower(fullNameW.substr(19));
	}

	return caseName.str();
}